

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

Seq __thiscall xt::VSeq::next(VSeq *this)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  VSeq *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  Seq SVar3;
  
  peVar2 = *(element_type **)(in_RSI + 8);
  if (*(int *)(in_RSI + 0x18) + 1U < peVar2->cnt) {
    __p = (VSeq *)operator_new(0x20);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x10);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    iVar1 = *(int *)(in_RSI + 0x18);
    (__p->super_ISeq)._vptr_ISeq = (_func_int **)&PTR_first_0010cb98;
    (__p->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    (__p->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00
    ;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    __p->index = iVar1 + 1;
    (this->super_ISeq)._vptr_ISeq = (_func_int **)__p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<xt::VSeq*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->v,__p);
    in_RDX._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      in_RDX._M_pi = extraout_RDX_00;
    }
  }
  else {
    (this->super_ISeq)._vptr_ISeq = (_func_int **)0x0;
    (this->v).super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  SVar3.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  SVar3.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_ISeq;
  return (Seq)SVar3.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Seq VSeq::next() const { if (index+1 < v->cnt) return Seq(new VSeq(v, index+1));  return Seq(); }